

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentStorageImage::RenderFragmentStorageImage
          (RenderFragmentStorageImage *this)

{
  RenderFragmentStorageImage *this_local;
  
  RenderPassCommand::RenderPassCommand(&this->super_RenderPassCommand);
  (this->super_RenderPassCommand)._vptr_RenderPassCommand =
       (_func_int **)&PTR__RenderFragmentStorageImage_016aa648;
  PipelineResources::PipelineResources(&this->m_resources);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(&this->m_descriptorPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(&this->m_descriptorSet);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_imageView);
  return;
}

Assistant:

RenderFragmentStorageImage	(void) {}